

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

rtosc_arg_t rtosc_argument(char *msg,uint idx)

{
  uint in_ESI;
  uint8_t *in_RDI;
  rtosc_arg_t rVar1;
  uint8_t *arg_mem;
  char type;
  uint in_stack_ffffffffffffffcc;
  char type_00;
  char *in_stack_ffffffffffffffd0;
  
  rtosc_type(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  type_00 = (char)(in_stack_ffffffffffffffcc >> 0x18);
  arg_off((char *)in_RDI,in_ESI);
  rVar1 = extract_arg(in_RDI,type_00);
  return rVar1;
}

Assistant:

rtosc_arg_t rtosc_argument(const char *msg, unsigned idx)
{
    char type = rtosc_type(msg, idx);
    uint8_t *arg_mem = (uint8_t*)msg + arg_off(msg, idx);
    return extract_arg(arg_mem, type);
}